

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resampler.c
# Opt level: O3

void Resmpl_Execute(RESMPL_STATE *CAA,UINT32 smplCount,WAVE_32BS *smplBuffer)

{
  if (smplCount != 0) {
    if (CAA->resampler != (RESAMPLER_FUNC)0x0) {
      (*CAA->resampler)(CAA,smplCount,smplBuffer);
      return;
    }
    CAA->smpP = CAA->smpP + CAA->smpRateDst;
  }
  return;
}

Assistant:

void Resmpl_Execute(RESMPL_STATE* CAA, UINT32 smplCount, WAVE_32BS* smplBuffer)
{
	if (! smplCount)
		return;
	
	if (CAA->resampler != NULL)
		CAA->resampler(CAA, smplCount, smplBuffer);
	else
		CAA->smpP += CAA->smpRateDst;	// just skip the samples and do nothing else
	return;
}